

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

bool duckdb::ToCStringCastWrapper<duckdb::StringCast>::Operation<unsigned_char,duckdb_string>
               (uchar input,duckdb_string *result)

{
  char *__dest;
  char *__src;
  ulong __n;
  Vector result_vector;
  string_t result_string;
  LogicalType LStack_b8;
  Vector local_a0;
  anon_union_16_2_67f50693_for_value local_38;
  
  LogicalType::LogicalType(&LStack_b8,VARCHAR);
  Vector::Vector(&local_a0,&LStack_b8,(data_ptr_t)0x0);
  LogicalType::~LogicalType(&LStack_b8);
  local_38.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)StringCast::Operation<unsigned_char>(input,&local_a0);
  __n = (ulong)local_38._0_4_;
  __src = local_38._8_8_;
  if (__n < 0xd) {
    __src = local_38.pointer.prefix;
  }
  __dest = (char *)malloc(__n + 1);
  switchD_012dd528::default(__dest,__src,__n);
  __dest[__n] = '\0';
  result->data = __dest;
  result->size = __n;
  if (local_a0.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_a0.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_a0.type);
  return true;
}

Assistant:

static bool Operation(SOURCE_TYPE input, RESULT_TYPE &result) {
		Vector result_vector(LogicalType::VARCHAR, nullptr);
		auto result_string = OP::template Operation<SOURCE_TYPE>(input, result_vector);
		auto result_size = result_string.GetSize();
		auto result_data = result_string.GetData();

		char *allocated_data = char_ptr_cast(duckdb_malloc(result_size + 1));
		memcpy(allocated_data, result_data, result_size);
		allocated_data[result_size] = '\0';
		result.data = allocated_data;
		result.size = result_size;
		return true;
	}